

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsParseSerialized(JsValueRef bufferVal,JsSerializedLoadScriptCallback scriptLoadCallback,
                 JsSourceContext sourceContext,JsValueRef sourceUrl,JsValueRef *result)

{
  bool bVar1;
  int iVar2;
  JsErrorCode JVar3;
  WCHAR *sourceUrl_00;
  ArrayBuffer *bufferVal_00;
  undefined4 extraout_var;
  
  JVar3 = JsErrorNullArgument;
  if (sourceUrl != (JsValueRef)0x0 && bufferVal != (JsValueRef)0x0) {
    bVar1 = Js::VarIs<Js::JavascriptString>(sourceUrl);
    JVar3 = JsErrorInvalidArgument;
    if (bVar1) {
      sourceUrl_00 = (WCHAR *)(**(code **)(*sourceUrl + 0x328))(sourceUrl);
      bVar1 = Js::VarIs<Js::ArrayBuffer>(bufferVal);
      if (bVar1) {
        bufferVal_00 = Js::VarTo<Js::ArrayBuffer>(bufferVal);
        iVar2 = (*(bufferVal_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(bufferVal_00);
        JVar3 = RunSerializedScriptCore<bool(*)(unsigned_long,void**,_JsParseScriptAttributes*),void(*)(unsigned_long)>
                          ((_func_bool_unsigned_long_void_ptr_ptr__JsParseScriptAttributes_ptr *)
                           scriptLoadCallback,DummyScriptUnloadCallback,sourceContext,
                           (uchar *)CONCAT44(extraout_var,iVar2),bufferVal_00,sourceContext,
                           sourceUrl_00,0,true,false,result,0xffffffff);
      }
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsParseSerialized(
    _In_ JsValueRef bufferVal,
    _In_ JsSerializedLoadScriptCallback scriptLoadCallback,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _Out_ JsValueRef *result)
{
    PARAM_NOT_NULL(bufferVal);
    PARAM_NOT_NULL(sourceUrl);

    const WCHAR *url;

    if (Js::VarIs<Js::JavascriptString>(sourceUrl))
    {
        url = ((Js::JavascriptString*)(sourceUrl))->GetSz();
    }
    else
    {
        return JsErrorInvalidArgument;
    }

    // JsParseSerialized only accepts ArrayBuffer (incl. ExternalArrayBuffer)
    if (!Js::VarIs<Js::ArrayBuffer>(bufferVal))
    {
        return JsErrorInvalidArgument;
    }

    Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(bufferVal);
    byte* buffer = arrayBuffer->GetBuffer();

    return RunSerializedScriptCore(
      scriptLoadCallback, DummyScriptUnloadCallback,
      sourceContext,// use the same user provided sourceContext as scriptLoadSourceContext
      buffer, arrayBuffer, sourceContext, url, 0, true, false, result, Js::Constants::InvalidSourceIndex);
}